

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall helics::CoreBroker::processQuery(CoreBroker *this,ActionMessage *message)

{
  ConnectionState CVar1;
  value_t vVar2;
  int iVar3;
  size_t sVar4;
  byte *pbVar5;
  json_value jVar6;
  __type_conflict1 _Var7;
  bool bVar8;
  byte bVar9;
  route_id rVar10;
  string *psVar11;
  iterator iVar12;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  _Var13;
  __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  _Var14;
  reference pvVar15;
  json *this_00;
  long lVar16;
  action_t startingAction;
  __node_base *p_Var17;
  char *pcVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  ulong uVar19;
  string_view searchValue;
  string_view searchValue_00;
  string_view gidString;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  allocator<char> local_1bd;
  uint local_1bc;
  json json;
  JsonMapBuilder globalSet;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  data local_138;
  ActionMessage queryResp;
  data local_70;
  data local_60;
  key_type local_50;
  
  startingAction = cmd_query_reply;
  if ((message->messageAction & cmd_priority_disconnect) == cmd_query_ordered) {
    startingAction = cmd_query_reply_ordered;
  }
  psVar11 = ActionMessage::getString_abi_cxx11_(message,0);
  _Var7 = std::operator==(psVar11,&(this->super_BrokerBase).identifier);
  if ((_Var7) || (bVar8 = std::operator==(psVar11,"broker"), bVar8)) {
LAB_0028a1a4:
    processLocalQuery(this,message);
    return;
  }
  bVar9 = (this->super_BrokerBase).field_0x294;
  if (bVar9 == 1) {
    bVar8 = std::operator==(psVar11,"root");
    if ((bVar8) || (bVar8 = std::operator==(psVar11,"federation"), bVar8)) goto LAB_0028a1a4;
    bVar9 = (this->super_BrokerBase).field_0x294;
  }
  if ((bVar9 & 1) == 0) {
LAB_0028a2d5:
    if (((bVar9 & 1) == 0) ||
       ((bVar8 = std::operator==(psVar11,"global"), !bVar8 &&
        (bVar8 = std::operator==(psVar11,"global_value"), !bVar8)))) {
      searchValue._M_str = (psVar11->_M_dataplus)._M_p;
      searchValue._M_len = psVar11->_M_string_length;
      _Var13 = gmlc::containers::
               DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
               ::find(&this->mFederates,searchValue);
      globalSet.jMap._M_t.
      super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      .
      super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_true,_true>
            )&globalSet.missing_components._M_t._M_impl.super__Rb_tree_header;
      globalSet.missing_components._M_t._M_impl._0_8_ = 0;
      globalSet.missing_components._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ =
           _S_red;
      if (_Var13._M_current ==
          (this->mFederates).dataStorage.
          super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        searchValue_00._M_str = (psVar11->_M_dataplus)._M_p;
        searchValue_00._M_len = psVar11->_M_string_length;
        _Var14 = gmlc::containers::
                 DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                 ::find(&this->mBrokers,searchValue_00);
        if (_Var14._M_current !=
            (this->mBrokers).dataStorage.
            super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_1bc = ((_Var14._M_current)->route).rid;
          (message->dest_id).gid = ((_Var14._M_current)->global_id).gid;
          sVar4 = (message->payload).bufferSize;
          pbVar5 = (message->payload).heap;
          queryResp._0_8_ = &queryResp.dest_id;
          queryResp.source_id.gid = 0;
          queryResp.source_handle.hid = 0;
          queryResp.dest_id.gid = queryResp.dest_id.gid & 0xffffff00;
          __y_01._M_str = "exists";
          __y_01._M_len = 6;
          __x_01._M_str = (char *)pbVar5;
          __x_01._M_len = sVar4;
          bVar8 = std::operator==(__x_01,__y_01);
          pcVar18 = "true";
          if (bVar8) {
LAB_0028a5b5:
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&queryResp,
                   pcVar18);
          }
          else {
            __y_02._M_str = "isconnected";
            __y_02._M_len = 0xb;
            __x_02._M_str = (char *)pbVar5;
            __x_02._M_len = sVar4;
            bVar8 = std::operator==(__x_02,__y_02);
            if (bVar8) {
              pcVar18 = "false";
              if ((_Var14._M_current)->state < (OPERATING|INIT_REQUESTED)) {
                pcVar18 = "true";
              }
              goto LAB_0028a5b5;
            }
            __y_08._M_str = "state";
            __y_08._M_len = 5;
            __x_08._M_str = (char *)pbVar5;
            __x_08._M_len = sVar4;
            bVar8 = std::operator==(__x_08,__y_08);
            if (bVar8) {
              psVar11 = stateString_abi_cxx11_((_Var14._M_current)->state);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &queryResp,psVar11);
            }
            else {
              __y_09._M_str = "isinit";
              __y_09._M_len = 6;
              __x_09._M_str = (char *)pbVar5;
              __x_09._M_len = sVar4;
              bVar8 = std::operator==(__x_09,__y_09);
              pcVar18 = "true";
              if ((bVar8) && (INIT_REQUESTED < (_Var14._M_current)->state)) goto LAB_0028a5b5;
            }
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&globalSet,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&queryResp)
          ;
          std::__cxx11::string::~string((string *)&queryResp);
          lVar16 = globalSet.missing_components._M_t._M_impl._0_8_;
          if (globalSet.missing_components._M_t._M_impl._0_8_ == 0) {
            CVar1 = (_Var14._M_current)->state;
            if (0x27 < CVar1) {
              if (CVar1 == ERROR_STATE) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&json,"target broker is in error state",
                           (allocator<char> *)&local_158);
                generateJsonErrorResponse((string *)&queryResp,SERVICE_UNAVAILABLE,(string *)&json);
              }
              else {
                if ((CVar1 != REQUEST_DISCONNECT) && (CVar1 != DISCONNECTED)) goto LAB_0028aa76;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&json,"federate is disconnected",(allocator<char> *)&local_158)
                ;
                generateJsonErrorResponse((string *)&queryResp,SERVICE_UNAVAILABLE,(string *)&json);
              }
              goto LAB_0028aa4f;
            }
            goto LAB_0028a9a0;
          }
          goto LAB_0028a9a2;
        }
        if (((this->super_BrokerBase).field_0x294 == '\x01') &&
           (__y_05._M_str = "exists", __y_05._M_len = 6,
           __x_05._M_str = (char *)(message->payload).heap,
           __x_05._M_len = (message->payload).bufferSize, bVar8 = std::operator==(__x_05,__y_05),
           bVar8)) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&globalSet,
                 "false");
        }
LAB_0028aa76:
        uVar19 = 0;
        lVar16 = globalSet.missing_components._M_t._M_impl._0_8_;
        if ((this->super_BrokerBase).field_0x294 == '\0') goto LAB_0028aae2;
        if (globalSet.missing_components._M_t._M_impl._0_8_ == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&json,"query not valid",(allocator<char> *)&local_158);
          generateJsonErrorResponse((string *)&queryResp,NOT_FOUND,(string *)&json);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&globalSet,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&queryResp)
          ;
          std::__cxx11::string::~string((string *)&queryResp);
          std::__cxx11::string::~string((string *)&json);
        }
      }
      else {
        local_1bc = ((_Var13._M_current)->route).rid;
        (message->dest_id).gid = ((_Var13._M_current)->parent).gid;
        sVar4 = (message->payload).bufferSize;
        pbVar5 = (message->payload).heap;
        queryResp._0_8_ = &queryResp.dest_id;
        queryResp.source_id.gid = 0;
        queryResp.source_handle.hid = 0;
        queryResp.dest_id.gid = queryResp.dest_id.gid & 0xffffff00;
        __y._M_str = "exists";
        __y._M_len = 6;
        __x._M_str = (char *)pbVar5;
        __x._M_len = sVar4;
        bVar8 = std::operator==(__x,__y);
        pcVar18 = "true";
        if (bVar8) {
LAB_0028a46e:
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&queryResp,
                 pcVar18);
        }
        else {
          __y_00._M_str = "isconnected";
          __y_00._M_len = 0xb;
          __x_00._M_str = (char *)pbVar5;
          __x_00._M_len = sVar4;
          bVar8 = std::operator==(__x_00,__y_00);
          if (bVar8) {
            pcVar18 = "false";
            if ((_Var13._M_current)->state < (OPERATING|INIT_REQUESTED)) {
              pcVar18 = "true";
            }
            goto LAB_0028a46e;
          }
          __y_04._M_str = "state";
          __y_04._M_len = 5;
          __x_04._M_str = (char *)pbVar5;
          __x_04._M_len = sVar4;
          bVar8 = std::operator==(__x_04,__y_04);
          if (bVar8) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &queryResp,'\"');
            psVar11 = stateString_abi_cxx11_((_Var13._M_current)->state);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&queryResp,
                   psVar11);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &queryResp,'\"');
          }
          else {
            __y_07._M_str = "isinit";
            __y_07._M_len = 6;
            __x_07._M_str = (char *)pbVar5;
            __x_07._M_len = sVar4;
            bVar8 = std::operator==(__x_07,__y_07);
            pcVar18 = "true";
            if ((bVar8) && (INIT_REQUESTED < (_Var13._M_current)->state)) goto LAB_0028a46e;
          }
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&globalSet,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&queryResp);
        std::__cxx11::string::~string((string *)&queryResp);
        lVar16 = globalSet.missing_components._M_t._M_impl._0_8_;
        if (globalSet.missing_components._M_t._M_impl._0_8_ == 0) {
          CVar1 = (_Var13._M_current)->state;
          if (0x27 < CVar1) {
            if ((CVar1 == DISCONNECTED) || (CVar1 == REQUEST_DISCONNECT)) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&json,"federate is disconnected",(allocator<char> *)&local_158);
              generateJsonErrorResponse((string *)&queryResp,SERVICE_UNAVAILABLE,(string *)&json);
            }
            else {
              if (CVar1 != ERROR_STATE) goto LAB_0028aa76;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&json,"federate is in error state",(allocator<char> *)&local_158)
              ;
              generateJsonErrorResponse((string *)&queryResp,SERVICE_UNAVAILABLE,(string *)&json);
            }
LAB_0028aa4f:
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &globalSet,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &queryResp);
            std::__cxx11::string::~string((string *)&queryResp);
            std::__cxx11::string::~string((string *)&json);
            goto LAB_0028aa76;
          }
LAB_0028a9a0:
          lVar16 = 0;
        }
LAB_0028a9a2:
        uVar19 = (ulong)local_1bc;
        if (local_1bc == 0) goto LAB_0028aa76;
LAB_0028aae2:
        if (lVar16 == 0) {
          if ((message->source_id).gid == (this->super_BrokerBase).global_broker_id_local.gid) {
            if ((this->queryTimeouts).
                super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                (this->queryTimeouts).
                super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              BrokerBase::setTickForwarding(&this->super_BrokerBase,QUERY_TIMEOUT,true);
            }
            queryResp._0_8_ = std::chrono::_V2::steady_clock::now();
            std::
            deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
            ::
            emplace_back<int&,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                      ((deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
                        *)&this->queryTimeouts,&message->messageID,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&queryResp);
          }
          (*(this->super_Broker)._vptr_Broker[0x22])(this,uVar19,message);
          goto LAB_0028ac0a;
        }
      }
      ActionMessage::ActionMessage(&queryResp,startingAction);
      queryResp.dest_id.gid = (message->source_id).gid;
      queryResp.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      queryResp.messageID = message->messageID;
      SmallBuffer::operator=
                (&queryResp.payload,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&globalSet);
      if (queryResp.dest_id.gid == (this->super_BrokerBase).global_broker_id_local.gid) {
        iVar3 = message->messageID;
        local_158._M_dataplus._M_p = (pointer)queryResp.payload.bufferSize;
        local_158._M_string_length = (size_type)queryResp.payload.heap;
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&json,(basic_string_view<char,_std::char_traits<char>_> *)&local_158,
                   &local_1bd);
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::setDelayedValue(&this->activeQueries,iVar3,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&json
                         );
        std::__cxx11::string::~string((string *)&json);
      }
      else {
        rVar10 = getRoute(this,queryResp.dest_id);
        (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)rVar10.rid,&queryResp);
      }
      ActionMessage::~ActionMessage(&queryResp);
LAB_0028ac0a:
      std::__cxx11::string::~string((string *)&globalSet);
      return;
    }
    ActionMessage::ActionMessage(&queryResp,startingAction);
    queryResp.dest_id.gid = (message->source_id).gid;
    queryResp.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
    queryResp.messageID = message->messageID;
    json.m_data._0_8_ = (message->payload).bufferSize;
    json.m_data.m_value = (json_value)(message->payload).heap;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&globalSet,(basic_string_view<char,_std::char_traits<char>_> *)&json,
               (allocator<char> *)&local_158);
    iVar12 = CLI::std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->global_values)._M_h,(key_type *)&globalSet);
    std::__cxx11::string::~string((string *)&globalSet);
    if (iVar12.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      __y_03._M_str = "list";
      __y_03._M_len = 4;
      __x_03._M_str = (char *)(message->payload).heap;
      __x_03._M_len = (message->payload).bufferSize;
      bVar8 = std::operator==(__x_03,__y_03);
      if (bVar8) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,"[",(allocator<char> *)&globalSet);
        p_Var17 = &(this->global_values)._M_h._M_before_begin;
        while (p_Var17 = p_Var17->_M_nxt, p_Var17 != (__node_base *)0x0) {
          std::__cxx11::string::string
                    ((string *)&json,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var17 + 1));
          generateJsonQuotedString((string *)&globalSet,(string *)&json);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append(&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&globalSet);
          std::__cxx11::string::~string((string *)&globalSet);
          std::__cxx11::string::~string((string *)&json);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(&local_158,',');
        }
        if (local_158._M_string_length < (byte *)0x2) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(&local_158,']');
        }
        else {
          (local_158._M_dataplus._M_p + -1)[local_158._M_string_length] = ']';
        }
        SmallBuffer::operator=
                  (&queryResp.payload,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158);
        this_01 = &local_158;
      }
      else {
        __y_06._M_str = "all";
        __y_06._M_len = 3;
        __x_06._M_str = (char *)(message->payload).heap;
        __x_06._M_len = (message->payload).bufferSize;
        bVar8 = std::operator==(__x_06,__y_06);
        if (bVar8) {
          fileops::JsonMapBuilder::JsonMapBuilder(&globalSet);
          this_00 = fileops::JsonMapBuilder::getJValue_abi_cxx11_(&globalSet);
          p_Var17 = &(this->global_values)._M_h._M_before_begin;
          while (p_Var17 = p_Var17->_M_nxt, p_Var17 != (__node_base *)0x0) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var17 + 5));
            std::__cxx11::string::string
                      ((string *)&local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var17 + 1));
            pvVar15 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::operator[](this_00,&local_50);
            vVar2 = (pvVar15->m_data).m_type;
            (pvVar15->m_data).m_type = local_138.m_type;
            jVar6 = (pvVar15->m_data).m_value;
            (pvVar15->m_data).m_value = local_138.m_value;
            local_138.m_type = vVar2;
            local_138.m_value = jVar6;
            std::__cxx11::string::~string((string *)&local_50);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_138);
          }
          fileops::JsonMapBuilder::generate_abi_cxx11_((string *)&json,&globalSet);
          SmallBuffer::operator=
                    (&queryResp.payload,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&json);
          std::__cxx11::string::~string((string *)&json);
          fileops::JsonMapBuilder::~JsonMapBuilder(&globalSet);
          goto LAB_0028acc6;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&json,"Global value not found",(allocator<char> *)&local_158);
        generateJsonErrorResponse((string *)&globalSet,NOT_FOUND,(string *)&json);
        SmallBuffer::operator=
                  (&queryResp.payload,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&globalSet);
        std::__cxx11::string::~string((string *)&globalSet);
        this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&json;
      }
      std::__cxx11::string::~string((string *)this_01);
    }
    else {
      bVar8 = std::operator==(psVar11,"global_value");
      if (bVar8) {
        SmallBuffer::operator=
                  (&queryResp.payload,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)iVar12.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                          ._M_cur + 0x28));
      }
      else {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json(&json,(nullptr_t)0x0);
        local_158._M_dataplus._M_p = (pointer)(message->payload).bufferSize;
        local_158._M_string_length = (size_type)(message->payload).heap;
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&globalSet,
                   (basic_string_view<char,_std::char_traits<char>_> *)&local_158,&local_1bd);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&globalSet);
        pvVar15 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&json,"name");
        vVar2 = (pvVar15->m_data).m_type;
        (pvVar15->m_data).m_type = local_60.m_type;
        jVar6 = (pvVar15->m_data).m_value;
        (pvVar15->m_data).m_value = local_60.m_value;
        local_60.m_type = vVar2;
        local_60.m_value = jVar6;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_60);
        std::__cxx11::string::~string((string *)&globalSet);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)iVar12.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                          ._M_cur + 0x28));
        pvVar15 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&json,"value");
        vVar2 = (pvVar15->m_data).m_type;
        (pvVar15->m_data).m_type = local_70.m_type;
        jVar6 = (pvVar15->m_data).m_value;
        (pvVar15->m_data).m_value = local_70.m_value;
        local_70.m_type = vVar2;
        local_70.m_value = jVar6;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_70);
        fileops::generateJsonString((string *)&globalSet,&json,true);
        SmallBuffer::operator=
                  (&queryResp.payload,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&globalSet);
        std::__cxx11::string::~string((string *)&globalSet);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&json.m_data);
      }
    }
LAB_0028acc6:
    if (queryResp.dest_id.gid != (this->super_BrokerBase).global_broker_id_local.gid) {
      rVar10 = getRoute(this,queryResp.dest_id);
      (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)rVar10.rid,&queryResp);
      goto LAB_0028ad41;
    }
    iVar3 = message->messageID;
    json.m_data._0_8_ = queryResp.payload.bufferSize;
    json.m_data.m_value.object = (object_t *)queryResp.payload.heap;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&globalSet,(basic_string_view<char,_std::char_traits<char>_> *)&json,
               (allocator<char> *)&local_158);
    gmlc::concurrency::
    DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::setDelayedValue(&this->activeQueries,iVar3,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &globalSet);
  }
  else {
    bVar8 = std::operator==(psVar11,"gid_to_name");
    if (!bVar8) {
      bVar9 = (this->super_BrokerBase).field_0x294;
      goto LAB_0028a2d5;
    }
    ActionMessage::ActionMessage(&queryResp,startingAction);
    queryResp.dest_id.gid = (message->source_id).gid;
    queryResp.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
    queryResp.messageID = message->messageID;
    gidString._M_str = (char *)(message->payload).heap;
    gidString._M_len = (message->payload).bufferSize;
    getNameList_abi_cxx11_((string *)&globalSet,this,gidString);
    SmallBuffer::operator=
              (&queryResp.payload,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&globalSet);
    std::__cxx11::string::~string((string *)&globalSet);
    if (queryResp.dest_id.gid != (this->super_BrokerBase).global_broker_id_local.gid) {
      rVar10 = getRoute(this,queryResp.dest_id);
      (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)rVar10.rid,&queryResp);
      goto LAB_0028ad41;
    }
    iVar3 = message->messageID;
    json.m_data._0_8_ = queryResp.payload.bufferSize;
    json.m_data.m_value.object = (object_t *)queryResp.payload.heap;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&globalSet,(basic_string_view<char,_std::char_traits<char>_> *)&json,
               (allocator<char> *)&local_158);
    gmlc::concurrency::
    DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::setDelayedValue(&this->activeQueries,iVar3,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &globalSet);
  }
  std::__cxx11::string::~string((string *)&globalSet);
LAB_0028ad41:
  ActionMessage::~ActionMessage(&queryResp);
  return;
}

Assistant:

void CoreBroker::processQuery(ActionMessage& message)
{
    const bool force_ordered =
        (message.action() == CMD_QUERY_ORDERED || message.action() == CMD_BROKER_QUERY_ORDERED);
    const auto& target = message.getString(targetStringLoc);
    if ((target == getIdentifier() || target == "broker") ||
        (isRootc && (target == "root" || target == "federation"))) {
        processLocalQuery(message);
    } else if (isRootc && target == "gid_to_name") {
        ActionMessage queryResp(force_ordered ? CMD_QUERY_REPLY_ORDERED : CMD_QUERY_REPLY);
        queryResp.dest_id = message.source_id;
        queryResp.source_id = global_broker_id_local;
        queryResp.messageID = message.messageID;
        queryResp.payload = getNameList(message.payload.to_string());
        if (queryResp.dest_id == global_broker_id_local) {
            activeQueries.setDelayedValue(message.messageID,
                                          std::string(queryResp.payload.to_string()));
        } else {
            transmit(getRoute(queryResp.dest_id), queryResp);
        }
    } else if ((isRootc) && (target == "global" || target == "global_value")) {
        ActionMessage queryResp(force_ordered ? CMD_QUERY_REPLY_ORDERED : CMD_QUERY_REPLY);
        queryResp.dest_id = message.source_id;
        queryResp.source_id = global_broker_id_local;
        queryResp.messageID = message.messageID;

        auto gfind = global_values.find(std::string(message.payload.to_string()));
        if (gfind != global_values.end()) {
            if (target == "global_value") {
                queryResp.payload = gfind->second;
            } else {
                nlohmann::json json;
                json["name"] = std::string(message.payload.to_string());
                json["value"] = gfind->second;
                queryResp.payload = fileops::generateJsonString(json);
            }
        } else if (message.payload.to_string() == "list") {
            queryResp.payload = generateStringVector(global_values, [](const auto& globalValue) {
                return globalValue.first;
            });
        } else if (message.payload.to_string() == "all") {
            fileops::JsonMapBuilder globalSet;
            auto& json = globalSet.getJValue();
            for (auto& val : global_values) {
                json[val.first] = val.second;
            }
            queryResp.payload = globalSet.generate();
        } else {
            queryResp.payload =
                generateJsonErrorResponse(JsonErrorCodes::NOT_FOUND, "Global value not found");
        }
        if (queryResp.dest_id == global_broker_id_local) {
            activeQueries.setDelayedValue(message.messageID,
                                          std::string(queryResp.payload.to_string()));
        } else {
            transmit(getRoute(queryResp.dest_id), queryResp);
        }
    } else {
        route_id route = parent_route_id;
        auto fed = mFederates.find(target);
        std::string response;
        if (fed != mFederates.end()) {
            route = fed->route;
            message.dest_id = fed->parent;
            response = checkFedQuery(*fed, message.payload.to_string());
            if (response.empty() && fed->state >= ConnectionState::ERROR_STATE) {
                route = parent_route_id;
                switch (fed->state) {
                    case ConnectionState::ERROR_STATE:
                        response = generateJsonErrorResponse(JsonErrorCodes::SERVICE_UNAVAILABLE,
                                                             "federate is in error state");
                        break;
                    case ConnectionState::DISCONNECTED:
                    case ConnectionState::REQUEST_DISCONNECT:
                        response = generateJsonErrorResponse(JsonErrorCodes::SERVICE_UNAVAILABLE,
                                                             "federate is disconnected");
                        break;
                    default:
                        break;
                }
            }
        } else {
            auto broker = mBrokers.find(target);
            if (broker != mBrokers.end()) {
                route = broker->route;
                message.dest_id = broker->global_id;
                response = checkBrokerQuery(*broker, message.payload.to_string());
                if (response.empty() && broker->state >= ConnectionState::ERROR_STATE) {
                    route = parent_route_id;
                    switch (broker->state) {
                        case ConnectionState::ERROR_STATE:
                            response =
                                generateJsonErrorResponse(JsonErrorCodes::SERVICE_UNAVAILABLE,
                                                          "target broker is in error state");
                            break;
                        case ConnectionState::DISCONNECTED:
                        case ConnectionState::REQUEST_DISCONNECT:
                            response =
                                generateJsonErrorResponse(JsonErrorCodes::SERVICE_UNAVAILABLE,
                                                          "federate is disconnected");
                            break;
                        default:
                            break;
                    }
                }
            } else if (isRootc && message.payload.to_string() == "exists") {
                response = "false";
            }
        }
        if (((route == parent_route_id) && (isRootc)) || !response.empty()) {
            if (response.empty()) {
                response = generateJsonErrorResponse(JsonErrorCodes::NOT_FOUND, "query not valid");
            }
            ActionMessage queryResp(force_ordered ? CMD_QUERY_REPLY_ORDERED : CMD_QUERY_REPLY);
            queryResp.dest_id = message.source_id;
            queryResp.source_id = global_broker_id_local;
            queryResp.messageID = message.messageID;

            queryResp.payload = response;
            if (queryResp.dest_id == global_broker_id_local) {
                activeQueries.setDelayedValue(message.messageID,
                                              std::string(queryResp.payload.to_string()));
            } else {
                transmit(getRoute(queryResp.dest_id), queryResp);
            }
        } else {
            if (message.source_id == global_broker_id_local) {
                if (queryTimeouts.empty()) {
                    setTickForwarding(TickForwardingReasons::QUERY_TIMEOUT, true);
                }
                queryTimeouts.emplace_back(message.messageID, std::chrono::steady_clock::now());
            }
            transmit(route, message);
        }
    }
}